

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

bool __thiscall CheckBox::update(CheckBox *this,int mouseX,int mouseY,bool clicked)

{
  bool bVar1;
  Vector2f *pVVar2;
  undefined1 in_CL;
  int in_EDX;
  int in_ESI;
  CheckBox *in_RDI;
  Transformable *this_00;
  FloatRect FVar3;
  undefined1 checked;
  undefined3 in_stack_ffffffffffffffec;
  float x;
  
  x = (float)(CONCAT13(in_CL,in_stack_ffffffffffffffec) & 0x1ffffff);
  if (((in_RDI->super_UIComponent).super_Transformable.field_0xa9 & 1) != 0) {
    this_00 = &(in_RDI->super_UIComponent).super_Transformable;
    pVVar2 = sf::Transformable::getPosition(this_00);
    in_ESI = in_ESI - (int)pVVar2->x;
    pVVar2 = sf::Transformable::getPosition(this_00);
    in_EDX = in_EDX - (int)pVVar2->y;
    FVar3 = sf::Shape::getGlobalBounds((Shape *)in_RDI);
    bVar1 = sf::Rect<float>::contains((Rect<float> *)CONCAT44(in_ESI,in_EDX),x,FVar3.height);
    checked = false;
    if (bVar1) {
      checked = (undefined1)((uint)x >> 0x18);
    }
    if ((checked & 1) != 0) {
      setChecked(in_RDI,(bool)checked);
    }
  }
  return false;
}

Assistant:

bool CheckBox::update(int mouseX, int mouseY, bool clicked) {
    if (visible) {
        mouseX -= static_cast<int>(getPosition().x);
        mouseY -= static_cast<int>(getPosition().y);
        if (button.getGlobalBounds().contains(static_cast<float>(mouseX), static_cast<float>(mouseY)) && clicked) {
            setChecked(!_checked);
        }
    }
    return false;
}